

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O2

void pgraph_dump_celsius_pipe(int cnum,pgraph_state *state)

{
  long lVar1;
  int i;
  uint32_t addr;
  uint32_t (*data) [3];
  uint32_t *puVar2;
  uint32_t word;
  pgraph_state *local_90;
  uint32_t vtx [20];
  
  *(undefined4 *)((long)nva_cards[cnum]->bar0 + 0x40014c) = 0x56;
  if (state->celsius_pipe_broke_ovtx == true) {
    pgraph_dump_pipe(cnum,0x4470,state->celsius_pipe_junk,4);
  }
  for (lVar1 = 0; lVar1 != 0x400; lVar1 = lVar1 + 0x40) {
    pgraph_dump_pipe(cnum,(uint)lVar1 | 0x800,
                     (uint32_t *)((long)state->celsius_pipe_ovtx[0] + lVar1),0x10);
  }
  pgraph_dump_pipe(cnum,0x4400,state->celsius_pipe_vtx,0x1c);
  if (state->celsius_pipe_broke_ovtx == false) {
    pgraph_dump_pipe(cnum,0x4470,state->celsius_pipe_junk,4);
  }
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x40) {
    pgraph_dump_pipe(cnum,(uint)lVar1 | 0x200,
                     (uint32_t *)((long)state->celsius_pipe_xvtx[0] + lVar1),0x10);
  }
  for (lVar1 = 0; lVar1 != 0x3c0; lVar1 = lVar1 + 0x10) {
    pgraph_dump_pipe(cnum,(uint)lVar1 | 0x6400,
                     (uint32_t *)((long)state->celsius_pipe_xfrm[0] + lVar1),4);
  }
  data = state->celsius_pipe_light_v;
  for (lVar1 = 0; lVar1 != 0x300; lVar1 = lVar1 + 0x10) {
    pgraph_dump_pipe(cnum,(uint)lVar1 | 0x6800,*data,3);
    data = data + 1;
  }
  puVar2 = state->celsius_pipe_light_sa;
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x10) {
    pgraph_dump_pipe(cnum,(uint)lVar1 | 0x6c00,puVar2,1);
    puVar2 = puVar2 + 1;
  }
  puVar2 = state->celsius_pipe_light_sb;
  for (lVar1 = 0; lVar1 != 0x130; lVar1 = lVar1 + 0x10) {
    pgraph_dump_pipe(cnum,(uint)lVar1 | 0x7000,puVar2,1);
    puVar2 = puVar2 + 1;
  }
  puVar2 = state->celsius_pipe_light_sc;
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x10) {
    pgraph_dump_pipe(cnum,(uint)lVar1 | 0x7400,puVar2,1);
    puVar2 = puVar2 + 1;
  }
  puVar2 = state->celsius_pipe_light_sd;
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x10) {
    pgraph_dump_pipe(cnum,(uint)lVar1 | 0x7800,puVar2,1);
    puVar2 = puVar2 + 1;
  }
  pgraph_dump_pipe(cnum,0,vtx,0x14);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    state->celsius_pipe_vtxbuf_offset[lVar1] = vtx[lVar1 * 2];
    state->celsius_pipe_vtxbuf_format[lVar1] = vtx[lVar1 * 2 + 1];
  }
  state->celsius_pipe_begin_end = vtx[0x10];
  state->celsius_pipe_edge_flag = vtx[0x11];
  state->celsius_pipe_unk48 = vtx[0x12];
  state->celsius_pipe_vtx_state = vtx[0x13];
  if ((state->chipset).chipset == 0x10) {
    addr = 0x3c;
    local_90 = state;
    for (lVar1 = 0; lVar1 != -7; lVar1 = lVar1 + -1) {
      word = 0;
      pgraph_load_pipe(cnum,4,&word,1);
      pgraph_dump_pipe(cnum,0x4c,&word,1);
      if (lVar1 + 7U != (ulong)(word & 0x1f)) {
        *(byte *)(local_90->celsius_pipe_vtxbuf_format + lVar1 + 7) =
             (byte)local_90->celsius_pipe_vtxbuf_format[lVar1 + 7] & 0x8f;
      }
      word = 0;
      pgraph_load_pipe(cnum,addr,&word,1);
      addr = addr - 8;
    }
  }
  return;
}

Assistant:

void pgraph_dump_celsius_pipe(int cnum, struct pgraph_state *state) {
	nva_wr32(cnum, 0x40014c, 0x00000056);
	if (state->celsius_pipe_broke_ovtx)
		pgraph_dump_pipe(cnum, 0x4470, state->celsius_pipe_junk, 4);
	for (int i = 0; i < 0x10; i++)
		pgraph_dump_pipe(cnum, 0x0800 + i * 0x40, state->celsius_pipe_ovtx[i], 0x10);
	pgraph_dump_pipe(cnum, 0x4400, state->celsius_pipe_vtx, 0x1c);
	if (!state->celsius_pipe_broke_ovtx)
		pgraph_dump_pipe(cnum, 0x4470, state->celsius_pipe_junk, 4);
	for (int i = 0; i < 3; i++)
		pgraph_dump_pipe(cnum, 0x0200 + i * 0x40, state->celsius_pipe_xvtx[i], 0x10);
	for (int i = 0; i < 0x3c; i++) {
		pgraph_dump_pipe(cnum, 0x6400 + i * 0x10, state->celsius_pipe_xfrm[i], 4);
	}
	for (int i = 0; i < 0x30; i++) {
		pgraph_dump_pipe(cnum, 0x6800 + i * 0x10, state->celsius_pipe_light_v[i], 3);
	}
	for (int i = 0; i < 3; i++) {
		pgraph_dump_pipe(cnum, 0x6c00 + i * 0x10, state->celsius_pipe_light_sa + i, 1);
	}
	for (int i = 0; i < 19; i++) {
		pgraph_dump_pipe(cnum, 0x7000 + i * 0x10, state->celsius_pipe_light_sb + i, 1);
	}
	for (int i = 0; i < 12; i++) {
		pgraph_dump_pipe(cnum, 0x7400 + i * 0x10, state->celsius_pipe_light_sc + i, 1);
	}
	for (int i = 0; i < 12; i++) {
		pgraph_dump_pipe(cnum, 0x7800 + i * 0x10, state->celsius_pipe_light_sd + i, 1);
	}
	uint32_t vtx[20];
	pgraph_dump_pipe(cnum, 0x0000, vtx, 20);
	for (int i = 0; i < 8; i++) {
		state->celsius_pipe_vtxbuf_offset[i] = vtx[2*i];
		state->celsius_pipe_vtxbuf_format[i] = vtx[2*i+1];
	}
	state->celsius_pipe_begin_end = vtx[16];
	state->celsius_pipe_edge_flag = vtx[17];
	state->celsius_pipe_unk48 = vtx[18];
	state->celsius_pipe_vtx_state = vtx[19];
	if (state->chipset.chipset == 0x10) {
		// Fuck me with a chainsaw.  On NV10, vtxbuf_format readout is broken in
		// two ways:
		//
		// 1. If component count is 0 (ie. a vtxbuf is disabled), it reads as some
		//    non-zero value depending on the attribute instead.
		// 2. Bit 2 of format of attribute 2 (ie. secondary color) comes from
		//    attribute 1 (primary color) instead.
		//
		// Work around #1 by observing the last active attribute in vtx_state.
		for (unsigned i = 7; i > 0; i--) {
			uint32_t word = 0;
			pgraph_load_pipe(cnum, 4, &word, 1);
			pgraph_dump_pipe(cnum, 0x4c, &word, 1);
			if (extr(word, 0, 5) != i)
				insrt(state->celsius_pipe_vtxbuf_format[i], 4, 3, 0);
			word = 0;
			pgraph_load_pipe(cnum, i*8+4, &word, 1);
		}
	}
}